

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCurl.cxx
# Opt level: O0

string * cmCurlSetCAInfo_abi_cxx11_(string *__return_storage_ptr__,CURL *curl,char *cafile)

{
  char cVar1;
  bool bVar2;
  CURLcode error;
  char *pcVar3;
  allocator local_61;
  CURLcode res_3;
  CURLcode local_3c;
  CURLcode local_38;
  CURLcode res_2;
  CURLcode res_1;
  CURLcode local_28;
  undefined1 local_21;
  CURLcode res;
  char *cafile_local;
  CURL *curl_local;
  string *e;
  
  local_21 = 0;
  _res = cafile;
  cafile_local = (char *)curl;
  curl_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if ((_res == (char *)0x0) || (*_res == '\0')) {
    bVar2 = cmsys::SystemTools::FileExists("/etc/pki/tls/certs/ca-bundle.crt",true);
    if (bVar2) {
      local_38 = curl_easy_setopt((Curl_easy *)cafile_local,CURLOPT_CAINFO,
                                  "/etc/pki/tls/certs/ca-bundle.crt");
      if ((local_38 != CURLE_OK) && (local_38 != CURLE_NOT_BUILT_IN)) {
        cVar1 = std::__cxx11::string::empty();
        pcVar3 = "\n";
        if (cVar1 != '\0') {
          pcVar3 = "";
        }
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar3);
        std::__cxx11::string::operator+=
                  ((string *)__return_storage_ptr__,"Unable to set TLS/SSL Verify CAINFO: ");
        pcVar3 = curl_easy_strerror(local_38);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar3);
      }
    }
    else {
      bVar2 = cmsys::SystemTools::FileExists("/etc/ssl/certs/ca-certificates.crt",true);
      if (((bVar2) &&
          (local_3c = curl_easy_setopt((Curl_easy *)cafile_local,CURLOPT_CAINFO,
                                       "/etc/ssl/certs/ca-certificates.crt"), local_3c != CURLE_OK))
         && (local_3c != CURLE_NOT_BUILT_IN)) {
        cVar1 = std::__cxx11::string::empty();
        pcVar3 = "\n";
        if (cVar1 != '\0') {
          pcVar3 = "";
        }
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar3);
        std::__cxx11::string::operator+=
                  ((string *)__return_storage_ptr__,"Unable to set TLS/SSL Verify CAINFO: ");
        pcVar3 = curl_easy_strerror(local_3c);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar3);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&res_3,"/etc/ssl/certs",&local_61);
      bVar2 = cmsys::SystemTools::FileIsDirectory((string *)&res_3);
      std::__cxx11::string::~string((string *)&res_3);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
      if (((bVar2) &&
          (error = curl_easy_setopt((Curl_easy *)cafile_local,CURLOPT_CAPATH,"/etc/ssl/certs"),
          error != CURLE_OK)) && (error != CURLE_NOT_BUILT_IN)) {
        cVar1 = std::__cxx11::string::empty();
        pcVar3 = "\n";
        if (cVar1 != '\0') {
          pcVar3 = "";
        }
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar3);
        std::__cxx11::string::operator+=
                  ((string *)__return_storage_ptr__,"Unable to set TLS/SSL Verify CAPATH: ");
        pcVar3 = curl_easy_strerror(error);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar3);
      }
    }
  }
  else {
    local_28 = curl_easy_setopt((Curl_easy *)cafile_local,CURLOPT_CAINFO,_res);
    if ((local_28 != CURLE_OK) && (local_28 != CURLE_NOT_BUILT_IN)) {
      cVar1 = std::__cxx11::string::empty();
      pcVar3 = "\n";
      if (cVar1 != '\0') {
        pcVar3 = "";
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar3);
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,"Unable to set TLS/SSL Verify CAINFO: ");
      pcVar3 = curl_easy_strerror(local_28);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCurlSetCAInfo(::CURL* curl, const char* cafile)
{
  std::string e;
  if (cafile && *cafile) {
    ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_CAINFO, cafile);
    check_curl_result(res, "Unable to set TLS/SSL Verify CAINFO: ");
  }
#ifdef CMAKE_FIND_CAFILE
#define CMAKE_CAFILE_FEDORA "/etc/pki/tls/certs/ca-bundle.crt"
  else if (cmSystemTools::FileExists(CMAKE_CAFILE_FEDORA, true)) {
    ::CURLcode res =
      ::curl_easy_setopt(curl, CURLOPT_CAINFO, CMAKE_CAFILE_FEDORA);
    check_curl_result(res, "Unable to set TLS/SSL Verify CAINFO: ");
  }
#undef CMAKE_CAFILE_FEDORA
  else {
#define CMAKE_CAFILE_COMMON "/etc/ssl/certs/ca-certificates.crt"
    if (cmSystemTools::FileExists(CMAKE_CAFILE_COMMON, true)) {
      ::CURLcode res =
        ::curl_easy_setopt(curl, CURLOPT_CAINFO, CMAKE_CAFILE_COMMON);
      check_curl_result(res, "Unable to set TLS/SSL Verify CAINFO: ");
    }
#undef CMAKE_CAFILE_COMMON
#define CMAKE_CAPATH_COMMON "/etc/ssl/certs"
    if (cmSystemTools::FileIsDirectory(CMAKE_CAPATH_COMMON)) {
      ::CURLcode res =
        ::curl_easy_setopt(curl, CURLOPT_CAPATH, CMAKE_CAPATH_COMMON);
      check_curl_result(res, "Unable to set TLS/SSL Verify CAPATH: ");
    }
#undef CMAKE_CAPATH_COMMON
  }
#endif
  return e;
}